

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O2

int Pla_ManExpendDirNum(word *pOn,int nBits,int iMint,int *pVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar2 = 0;
  if (nBits < 1) {
    nBits = 0;
  }
  iVar1 = 0;
  for (; nBits != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = iMint ^ 1 << (uVar2 & 0x1f);
    if ((pOn[(int)uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      lVar4 = (long)iVar1;
      iVar1 = iVar1 + 1;
      pVars[lVar4] = uVar2;
    }
  }
  return iVar1;
}

Assistant:

int Pla_ManExpendDirNum( word * pOn, int nBits, int iMint, int * pVars )
{
    int v, nVars = 0;
    for ( v = 0; v < nBits; v++ )
        if ( Pla_TtGetBit(pOn, iMint ^ (1 << v)) )
            pVars[nVars++] = v;
    return nVars;
}